

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::CreateSynchWaitController
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CObjectType *potObjectType,
          VOID *pvSynchData,ObjectDomain odObjectDomain,ISynchWaitController **ppWaitController)

{
  ISynchWaitController IVar1;
  PAL_ERROR PVar2;
  ISynchWaitController local_50;
  CSynchWaitController *pObj;
  CObjectType *local_40;
  ObjectDomain local_38;
  byte local_31;
  
  local_31 = odObjectDomain == SharedObject;
  pObj = (CSynchWaitController *)ppWaitController;
  local_40 = potObjectType;
  local_38 = odObjectDomain;
  if ((bool)local_31) {
    pvSynchData = SHMPtrToPtr((SHMPTR)pvSynchData);
  }
  local_50._vptr_ISynchWaitController = (_func_int **)0x0;
  CSynchCache<CorUnix::CSynchWaitController>::Get
            (&this->m_cacheWaitCtrlrs,pthrCurrent,1,(CSynchWaitController **)&local_50);
  IVar1._vptr_ISynchWaitController = local_50._vptr_ISynchWaitController;
  if (local_50._vptr_ISynchWaitController == (_func_int **)0x0) {
    PVar2 = 8;
  }
  else {
    PVar2 = 0;
    CSynchControllerBase::Init
              ((CSynchControllerBase *)(local_50._vptr_ISynchWaitController + 1),pthrCurrent,
               WaitController,local_38,local_40,(CSynchData *)pvSynchData,(uint)local_31 * 2);
    (pObj->super_ISynchWaitController)._vptr_ISynchWaitController = IVar1._vptr_ISynchWaitController
    ;
  }
  return PVar2;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::CreateSynchWaitController(
        CPalThread *pthrCurrent,
        CObjectType *potObjectType,
        VOID *pvSynchData,
        ObjectDomain odObjectDomain,
        ISynchWaitController **ppWaitController)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchWaitController * pCtrlr =  NULL;
        WaitDomain wdWaitDomain = (SharedObject == odObjectDomain) ? SharedWait : LocalWait;
        CSynchData * psdSynchData;

        psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
            CSynchData, reinterpret_cast<SharedID>(pvSynchData)) :
            static_cast<CSynchData *>(pvSynchData);

        VALIDATEOBJECT(psdSynchData);

        pCtrlr = m_cacheWaitCtrlrs.Get(pthrCurrent);
        if (NULL == pCtrlr)
        {
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto CSWC_exit;
        }

        pCtrlr->Init(pthrCurrent,
                     CSynchControllerBase::WaitController,
                     odObjectDomain,
                     potObjectType,
                     psdSynchData,
                     wdWaitDomain);

        // Succeeded
        *ppWaitController = (ISynchWaitController *)pCtrlr;

    CSWC_exit:
        if ((NO_ERROR != palErr) && (NULL != pCtrlr))
        {
            m_cacheWaitCtrlrs.Add(pthrCurrent, pCtrlr);
        }
        return palErr;
    }